

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O0

void __thiscall
myvk::CommandBuffer::CmdBlitImage
          (CommandBuffer *this,Ptr<ImageView> *src_view,Ptr<ImageView> *dst_view,VkFilter filter)

{
  VkCommandBuffer pVVar1;
  PFN_vkCmdBlitImage p_Var2;
  uint32_t uVar3;
  element_type *peVar4;
  VkImageSubresourceRange *pVVar5;
  element_type *peVar6;
  VkExtent3D *pVVar7;
  uint *puVar8;
  VkImage pVVar9;
  VkImage pVVar10;
  size_type sVar11;
  VkImageBlit *pVVar12;
  VkFilter in_ECX;
  long in_RDI;
  VkImageBlit blit;
  uint32_t i;
  VkExtent3D dst_extent;
  VkExtent3D *src_extent;
  VkImageSubresourceRange dst_subres;
  VkImageSubresourceRange *src_subres;
  vector<VkImageBlit,_std::allocator<VkImageBlit>_> blits;
  value_type *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  uint local_140 [3];
  uint local_134;
  uint local_130 [3];
  uint uStack_124;
  uint local_11c [3];
  uint local_110;
  uint local_10c [3];
  uint uStack_100;
  undefined4 local_f8;
  uint uStack_f4;
  undefined4 uStack_f0;
  uint32_t uStack_ec;
  VkImageAspectFlags local_e8;
  uint uStack_e4;
  uint32_t uStack_e0;
  uint32_t uStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  uint uStack_b4;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  uint uStack_8c;
  uint local_80;
  undefined8 local_7c;
  uint32_t local_74;
  VkExtent3D *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  uint32_t local_58;
  VkImageSubresourceRange *local_40;
  vector<VkImageBlit,_std::allocator<VkImageBlit>_> local_38;
  VkFilter local_1c;
  
  local_1c = in_ECX;
  std::vector<VkImageBlit,_std::allocator<VkImageBlit>_>::vector
            ((vector<VkImageBlit,_std::allocator<VkImageBlit>_> *)0x2ad3d3);
  peVar4 = std::__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ad3e0);
  local_40 = ImageView::GetSubresourceRange(peVar4);
  peVar4 = std::__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ad40f);
  pVVar5 = ImageView::GetSubresourceRange(peVar4);
  local_58 = pVVar5->layerCount;
  local_68._0_4_ = pVVar5->aspectMask;
  local_68._4_4_ = pVVar5->baseMipLevel;
  uStack_60._0_4_ = pVVar5->levelCount;
  uStack_60._4_4_ = pVVar5->baseArrayLayer;
  peVar4 = std::__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ad44b);
  ImageView::GetImagePtr(peVar4);
  peVar6 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ad46a);
  local_70 = ImageBase::GetExtent(peVar6);
  peVar4 = std::__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ad499);
  ImageView::GetImagePtr(peVar4);
  peVar6 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ad4b8);
  pVVar7 = ImageBase::GetExtent(peVar6);
  local_7c._0_4_ = pVVar7->width;
  local_7c._4_4_ = pVVar7->height;
  local_74 = pVVar7->depth;
  for (local_80 = local_40->baseMipLevel; p_Var2 = vkCmdBlitImage,
      local_80 < local_40->baseMipLevel + local_40->levelCount; local_80 = local_80 + 1) {
    local_98 = 0;
    uStack_94 = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    uStack_a0 = 0;
    uStack_b8 = 0;
    uStack_b4 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    uStack_bc = 0;
    local_e8 = local_40->aspectMask;
    uStack_e4 = local_80;
    uStack_e0 = local_40->baseArrayLayer;
    uStack_dc = local_40->layerCount;
    uStack_d0._0_4_ = local_40->baseArrayLayer;
    uStack_d0._4_4_ = local_40->layerCount;
    local_d8 = CONCAT44(local_80,local_e8);
    local_f8 = (undefined4)local_68;
    uStack_f4 = local_80;
    uStack_f0 = uStack_60._4_4_;
    uStack_ec = local_58;
    uStack_b0 = CONCAT44(local_80,(undefined4)local_68);
    local_a8 = CONCAT44(local_58,uStack_60._4_4_);
    local_10c[1] = 1;
    local_10c[0] = local_70->width >> ((byte)local_80 & 0x1f);
    puVar8 = std::max<unsigned_int>(local_10c + 1,local_10c);
    local_10c[2] = *puVar8;
    local_110 = 1;
    local_11c[2] = local_70->height >> ((byte)local_80 & 0x1f);
    puVar8 = std::max<unsigned_int>(&local_110,local_11c + 2);
    uStack_100 = *puVar8;
    local_11c[1] = 1;
    local_11c[0] = local_70->depth >> ((byte)local_80 & 0x1f);
    puVar8 = std::max<unsigned_int>(local_11c + 1,local_11c);
    uStack_b4 = *puVar8;
    uStack_bc = (undefined4)stack0xfffffffffffffefc;
    uStack_b8 = (undefined4)((ulong)stack0xfffffffffffffefc >> 0x20);
    local_130[1] = 1;
    local_130[0] = (uint)local_7c >> ((byte)local_80 & 0x1f);
    puVar8 = std::max<unsigned_int>(local_130 + 1,local_130);
    local_130[2] = *puVar8;
    local_134 = 1;
    local_140[2] = local_7c._4_4_ >> ((byte)local_80 & 0x1f);
    puVar8 = std::max<unsigned_int>(&local_134,local_140 + 2);
    uStack_124 = *puVar8;
    local_140[1] = 1;
    local_140[0] = local_74 >> ((byte)local_80 & 0x1f);
    puVar8 = std::max<unsigned_int>(local_140 + 1,local_140);
    uStack_8c = *puVar8;
    uStack_94 = (undefined4)stack0xfffffffffffffed8;
    uStack_90 = (undefined4)((ulong)stack0xfffffffffffffed8 >> 0x20);
    std::vector<VkImageBlit,_std::allocator<VkImageBlit>_>::push_back
              ((vector<VkImageBlit,_std::allocator<VkImageBlit>_> *)
               CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8);
  }
  pVVar1 = *(VkCommandBuffer *)(in_RDI + 0x28);
  peVar4 = std::__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ad8e7);
  ImageView::GetImagePtr(peVar4);
  peVar6 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ad900);
  pVVar9 = ImageBase::GetHandle(peVar6);
  peVar4 = std::__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ad91c);
  ImageView::GetImagePtr(peVar4);
  peVar6 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2ad935);
  pVVar10 = ImageBase::GetHandle(peVar6);
  sVar11 = std::vector<VkImageBlit,_std::allocator<VkImageBlit>_>::size(&local_38);
  uVar3 = (uint32_t)sVar11;
  pVVar12 = std::vector<VkImageBlit,_std::allocator<VkImageBlit>_>::data
                      ((vector<VkImageBlit,_std::allocator<VkImageBlit>_> *)0x2ad964);
  (*p_Var2)(pVVar1,pVVar9,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,pVVar10,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,uVar3,pVVar12,local_1c);
  std::vector<VkImageBlit,_std::allocator<VkImageBlit>_>::~vector
            ((vector<VkImageBlit,_std::allocator<VkImageBlit>_> *)
             CONCAT44(uVar3,in_stack_fffffffffffffdf0));
  return;
}

Assistant:

void CommandBuffer::CmdBlitImage(const Ptr<ImageView> &src_view, const Ptr<ImageView> &dst_view,
                                 VkFilter filter) const {
	std::vector<VkImageBlit> blits;
	const auto &src_subres = src_view->GetSubresourceRange(), dst_subres = dst_view->GetSubresourceRange();
	const auto &src_extent = src_view->GetImagePtr()->GetExtent(), dst_extent = dst_view->GetImagePtr()->GetExtent();
	for (uint32_t i = src_subres.baseMipLevel; i < src_subres.baseMipLevel + src_subres.levelCount; ++i) {
		VkImageBlit blit = {};
		blit.srcSubresource = {src_subres.aspectMask, i, src_subres.baseArrayLayer, src_subres.layerCount};
		blit.dstSubresource = {dst_subres.aspectMask, i, dst_subres.baseArrayLayer, dst_subres.layerCount};
		blit.srcOffsets[1] = {
		    (int32_t)std::max(1u, src_extent.width >> i),
		    (int32_t)std::max(1u, src_extent.height >> i),
		    (int32_t)std::max(1u, src_extent.depth >> i),
		};
		blit.dstOffsets[1] = {
		    (int32_t)std::max(1u, dst_extent.width >> i),
		    (int32_t)std::max(1u, dst_extent.height >> i),
		    (int32_t)std::max(1u, dst_extent.depth >> i),
		};
		blits.push_back(blit);
	}
	vkCmdBlitImage(m_command_buffer, src_view->GetImagePtr()->GetHandle(), VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
	               dst_view->GetImagePtr()->GetHandle(), VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, blits.size(),
	               blits.data(), filter);
}